

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

void __thiscall
pbrt::ParsedScene::LookAt
          (ParsedScene *this,Float ex,Float ey,Float ez,Float lx,Float ly,Float lz,Float ux,Float uy
          ,Float uz,FileLoc loc)

{
  Transform *__dest;
  long in_RDI;
  int i;
  Transform lookAt;
  Vector3f *in_stack_000001e8;
  Point3f *in_stack_000001f0;
  Point3f *in_stack_000001f8;
  float in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffe9c;
  Point3<float> *this_00;
  undefined1 local_150 [32];
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  TransformSet *in_stack_fffffffffffffed8;
  FileLoc *in_stack_fffffffffffffee0;
  Transform *in_stack_ffffffffffffff28;
  int iVar1;
  undefined4 in_stack_ffffffffffffff34;
  
  this_00 = (Point3<float> *)&stack0x00000010;
  if (*(int *)(in_RDI + 0x860) == 2) {
    Error<char_const(&)[7]>
              (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8,
               (char (*) [7])CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  }
  else {
    Point3<float>::Point3(this_00,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,0.0);
    Point3<float>::Point3(this_00,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,0.0);
    Vector3<float>::Vector3
              ((Vector3<float> *)this_00,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,0.0);
    pbrt::LookAt(in_stack_000001f8,in_stack_000001f0,in_stack_000001e8);
    for (iVar1 = 0; iVar1 < 2; iVar1 = iVar1 + 1) {
      if ((*(uint *)(in_RDI + 0x964) & 1 << ((byte)iVar1 & 0x1f)) != 0) {
        TransformSet::operator[](in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
        pbrt::Transform::operator*
                  ((Transform *)CONCAT44(in_stack_ffffffffffffff34,iVar1),in_stack_ffffffffffffff28)
        ;
        __dest = TransformSet::operator[](in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
        memcpy(__dest,local_150,0x80);
      }
    }
  }
  return;
}

Assistant:

void ParsedScene::LookAt(Float ex, Float ey, Float ez, Float lx, Float ly, Float lz,
                         Float ux, Float uy, Float uz, FileLoc loc) {
    VERIFY_INITIALIZED("LookAt");
    class Transform lookAt =
        pbrt::LookAt(Point3f(ex, ey, ez), Point3f(lx, ly, lz), Vector3f(ux, uy, uz));
    FOR_ACTIVE_TRANSFORMS(curTransform[i] = curTransform[i] * lookAt;);
}